

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turnning.c
# Opt level: O0

double calculateAngle325(double *list,int size)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double num_1;
  double num;
  double avgPiece;
  double angleDifference;
  double angleDifferenceABS;
  double avgNegative;
  double avgPositive;
  double percent;
  double sum;
  double *pdStack_38;
  int i;
  double *negativeList;
  double *positiveList;
  int negative;
  int positive;
  int count;
  int size_local;
  double *list_local;
  
  negative = 0;
  positiveList._4_4_ = 0;
  positiveList._0_4_ = 0;
  if (size == 0) {
    list_local = (double *)0x0;
  }
  else {
    negativeList = (double *)malloc(8);
    pdStack_38 = (double *)malloc(8);
    for (sum._4_4_ = 0; sum._4_4_ < size; sum._4_4_ = sum._4_4_ + 1) {
      if (list[sum._4_4_] < 0.0) {
        pdStack_38[(int)positiveList] = list[sum._4_4_];
        pdStack_38 = (double *)realloc(pdStack_38,(long)((int)positiveList + 2) << 3);
        positiveList._0_4_ = (int)positiveList + 1;
      }
      else {
        negativeList[positiveList._4_4_] = list[sum._4_4_];
        negativeList = (double *)realloc(negativeList,(long)(positiveList._4_4_ + 2) << 3);
        positiveList._4_4_ = positiveList._4_4_ + 1;
      }
      if ((90.0 < list[sum._4_4_]) || (list[sum._4_4_] <= -90.0 && list[sum._4_4_] != -90.0)) {
        negative = negative + 1;
      }
    }
    dVar1 = (double)size;
    if (positiveList._4_4_ != 0) {
      if (((double)positiveList._4_4_ != dVar1) || (NAN((double)positiveList._4_4_) || NAN(dVar1)))
      {
        if ((double)negative <= dVar1 * 0.3) {
          dVar1 = calculateAvg(list,size);
          return dVar1;
        }
        dVar2 = calculateAvg(negativeList,positiveList._4_4_);
        dVar3 = calculateAvg(pdStack_38,(int)positiveList);
        avgPiece = ABS(dVar2 - dVar3);
        if (180.0 <= avgPiece) {
          avgPiece = 360.0 - avgPiece;
        }
        if (180.0 < ABS(dVar3) + ABS(dVar2)) {
          dVar3 = -(double)positiveList._4_4_ * (avgPiece / dVar1) + dVar3;
          if (-180.0 <= dVar3) {
            return dVar3;
          }
          return dVar3 + 360.0;
        }
        return (double)positiveList._4_4_ * (avgPiece / dVar1) + dVar3;
      }
    }
    list_local = (double *)calculateAvg(list,size);
  }
  return (double)list_local;
}

Assistant:

double calculateAngle325(double* list,int size){
    int count = 0;
    int positive = 0, negative = 0;
    if(size != 0){
        double *positiveList = (double*)malloc(sizeof(double));
        double *negativeList = (double*)malloc(sizeof(double));
        for (int i = 0; i < size; i++) {
            if(list[i] >= 0){
                positiveList[positive++] = list[i];
                positiveList = realloc(positiveList, sizeof(double) * (positive + 1));
            }else{
                negativeList[negative++] = list[i];
                negativeList = realloc(negativeList, sizeof(double) * (negative + 1));
            }
            if(list[i] > 90 || list[i] < -90)
                count++;
        }
        double sum = size;
        double percent = positive / sum;
        if(positive == 0 || positive == sum)
            return calculateAvg(list,size);
        if(count > sum * 0.3){
            double avgPositive = calculateAvg(positiveList,positive);
            double avgNegative = calculateAvg(negativeList,negative);

            double angleDifferenceABS = fabs(avgPositive - avgNegative);
            double angleDifference = 0;

            if(angleDifferenceABS >= 180){
                angleDifference = 360 - angleDifferenceABS;
            }else{
                angleDifference = angleDifferenceABS;
            }
            double avgPiece = angleDifference / sum;

            if(fabs(avgNegative) + fabs(avgPositive) > 180){
                double num = avgNegative - positive * avgPiece;
                if(num < -180)
                    return num + 360;
                else
                    return num;
            }else{
                double num = avgNegative + positive * avgPiece;
                return num;
            }
        }else{
            return calculateAvg(list,size);
        }
    }else{
        return 0;
    }
}